

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void __thiscall OpenSteer::DrawSphereHelper::draw(DrawSphereHelper *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec3 VVar5;
  Vec3 local_f8;
  Vec3 local_e8;
  Vec3 local_d8;
  Vec3 local_c8;
  Vec3 local_b8;
  Vec3 local_a8;
  Vec3 local_98;
  Vec3 local_88;
  Vec3 local_78;
  Vec3 local_68;
  Vec3 local_58;
  Vec3 local_48;
  Vec3 local_3c;
  
  fVar1 = this->radius / 0.58778524;
  fVar4 = fVar1 * 0.5;
  fVar1 = fVar1 / 3.236068;
  fVar2 = -fVar4;
  local_58._0_8_ = (ulong)(uint)fVar1 << 0x20;
  local_58.z = fVar2;
  VVar5 = Vec3::operator+(&this->center,&local_58);
  local_48.z = VVar5.z;
  local_48._0_8_ = VVar5._0_8_;
  local_c8.y = fVar4;
  local_c8.x = fVar1;
  local_c8.z = 0.0;
  VVar5 = Vec3::operator+(&this->center,&local_c8);
  local_58.z = VVar5.z;
  local_58._0_8_ = VVar5._0_8_;
  fVar3 = -fVar1;
  local_68._0_8_ = CONCAT44(fVar4,fVar1) ^ 0x80000000;
  local_68.z = 0.0;
  VVar5 = Vec3::operator+(&this->center,&local_68);
  local_c8.z = VVar5.z;
  local_c8._0_8_ = VVar5._0_8_;
  local_78._0_8_ = (ulong)(uint)fVar1 << 0x20;
  local_78.z = fVar4;
  VVar5 = Vec3::operator+(&this->center,&local_78);
  local_68.z = VVar5.z;
  local_68._0_8_ = VVar5._0_8_;
  local_d8._0_8_ = (ulong)(uint)fVar3 << 0x20;
  local_d8.z = fVar4;
  VVar5 = Vec3::operator+(&this->center,&local_d8);
  local_78.z = VVar5.z;
  local_78._0_8_ = VVar5._0_8_;
  local_88.y = 0.0;
  local_88.x = fVar2;
  local_88.z = fVar1;
  VVar5 = Vec3::operator+(&this->center,&local_88);
  local_d8.z = VVar5.z;
  local_d8._0_8_ = VVar5._0_8_;
  local_e8._0_8_ = (ulong)(uint)fVar3 << 0x20;
  local_e8.z = fVar2;
  VVar5 = Vec3::operator+(&this->center,&local_e8);
  local_88.z = VVar5.z;
  local_88._0_8_ = VVar5._0_8_;
  local_f8.y = 0.0;
  local_f8.x = fVar4;
  local_f8.z = fVar3;
  VVar5 = Vec3::operator+(&this->center,&local_f8);
  local_e8.z = VVar5.z;
  local_e8._0_8_ = VVar5._0_8_;
  local_98.y = 0.0;
  local_98.x = fVar4;
  local_98.z = fVar1;
  VVar5 = Vec3::operator+(&this->center,&local_98);
  local_f8.z = VVar5.z;
  local_f8._0_8_ = VVar5._0_8_;
  local_a8.y = 0.0;
  local_a8.x = fVar2;
  local_a8.z = fVar3;
  VVar5 = Vec3::operator+(&this->center,&local_a8);
  local_98.z = VVar5.z;
  local_98._0_8_ = VVar5._0_8_;
  local_b8._0_8_ = CONCAT44(fVar4,fVar1) ^ 0x8000000000000000;
  local_b8.z = 0.0;
  VVar5 = Vec3::operator+(&this->center,&local_b8);
  local_a8.z = VVar5.z;
  local_a8._0_8_ = VVar5._0_8_;
  local_3c.z = 0.0;
  local_3c.x = fVar3;
  local_3c.y = fVar2;
  VVar5 = Vec3::operator+(&this->center,&local_3c);
  local_b8.z = VVar5.z;
  local_b8._0_8_ = VVar5._0_8_;
  drawMeshedTriangleOnSphere(this,&local_48,&local_58,&local_c8);
  drawMeshedTriangleOnSphere(this,&local_68,&local_c8,&local_58);
  drawMeshedTriangleOnSphere(this,&local_68,&local_78,&local_d8);
  drawMeshedTriangleOnSphere(this,&local_68,&local_f8,&local_78);
  drawMeshedTriangleOnSphere(this,&local_48,&local_88,&local_e8);
  drawMeshedTriangleOnSphere(this,&local_48,&local_98,&local_88);
  drawMeshedTriangleOnSphere(this,&local_78,&local_a8,&local_b8);
  drawMeshedTriangleOnSphere(this,&local_88,&local_b8,&local_a8);
  drawMeshedTriangleOnSphere(this,&local_c8,&local_d8,&local_98);
  drawMeshedTriangleOnSphere(this,&local_b8,&local_98,&local_d8);
  drawMeshedTriangleOnSphere(this,&local_58,&local_e8,&local_f8);
  drawMeshedTriangleOnSphere(this,&local_a8,&local_f8,&local_e8);
  drawMeshedTriangleOnSphere(this,&local_68,&local_d8,&local_c8);
  drawMeshedTriangleOnSphere(this,&local_68,&local_58,&local_f8);
  drawMeshedTriangleOnSphere(this,&local_48,&local_c8,&local_98);
  drawMeshedTriangleOnSphere(this,&local_48,&local_e8,&local_58);
  drawMeshedTriangleOnSphere(this,&local_88,&local_98,&local_b8);
  drawMeshedTriangleOnSphere(this,&local_88,&local_a8,&local_e8);
  drawMeshedTriangleOnSphere(this,&local_78,&local_b8,&local_d8);
  drawMeshedTriangleOnSphere(this,&local_78,&local_f8,&local_a8);
  return;
}

Assistant:

void draw (void) const
        {
            // Geometry based on Paul Bourke's excellent article:
            //   Platonic Solids (Regular polytopes in 3D)
            //   http://astronomy.swin.edu.au/~pbourke/polyhedra/platonic/
            const float sqrt5 = sqrtXXX (5.0f);
            const float phi = (1.0f + sqrt5) * 0.5f; // "golden ratio"
            // ratio of edge length to radius
            const float ratio = sqrtXXX (10.0f + (2.0f * sqrt5)) / (4.0f * phi);
            const float a = (radius / ratio) * 0.5f;
            const float b = (radius / ratio) / (2.0f * phi);

            // define the icosahedron's 12 vertices:
            const Vec3 v1  = center + Vec3 ( 0,  b, -a);
            const Vec3 v2  = center + Vec3 ( b,  a,  0);
            const Vec3 v3  = center + Vec3 (-b,  a,  0);
            const Vec3 v4  = center + Vec3 ( 0,  b,  a);
            const Vec3 v5  = center + Vec3 ( 0, -b,  a);
            const Vec3 v6  = center + Vec3 (-a,  0,  b);
            const Vec3 v7  = center + Vec3 ( 0, -b, -a);
            const Vec3 v8  = center + Vec3 ( a,  0, -b);
            const Vec3 v9  = center + Vec3 ( a,  0,  b);
            const Vec3 v10 = center + Vec3 (-a,  0, -b);
            const Vec3 v11 = center + Vec3 ( b, -a,  0);
            const Vec3 v12 = center + Vec3 (-b, -a,  0);

            // draw the icosahedron's 20 triangular faces:
            drawMeshedTriangleOnSphere (v1, v2, v3);
            drawMeshedTriangleOnSphere (v4, v3, v2);
            drawMeshedTriangleOnSphere (v4, v5, v6);
            drawMeshedTriangleOnSphere (v4, v9, v5);
            drawMeshedTriangleOnSphere (v1, v7, v8);
            drawMeshedTriangleOnSphere (v1, v10, v7);
            drawMeshedTriangleOnSphere (v5, v11, v12);
            drawMeshedTriangleOnSphere (v7, v12, v11);
            drawMeshedTriangleOnSphere (v3, v6, v10);
            drawMeshedTriangleOnSphere (v12, v10, v6);
            drawMeshedTriangleOnSphere (v2, v8, v9);
            drawMeshedTriangleOnSphere (v11, v9, v8);
            drawMeshedTriangleOnSphere (v4, v6, v3);
            drawMeshedTriangleOnSphere (v4, v2, v9);
            drawMeshedTriangleOnSphere (v1, v3, v10);
            drawMeshedTriangleOnSphere (v1, v8, v2);
            drawMeshedTriangleOnSphere (v7, v10, v12);
            drawMeshedTriangleOnSphere (v7, v11, v8);
            drawMeshedTriangleOnSphere (v5, v12, v6);
            drawMeshedTriangleOnSphere (v5, v9, v11);
        }